

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

uint32_t __thiscall wasm::WasmBinaryWriter::getSignatureIndex(WasmBinaryWriter *this,Signature sig)

{
  bool bVar1;
  ostream *poVar2;
  pointer pvVar3;
  Type in_RCX;
  Signature sig_00;
  _Node_iterator_base<std::pair<const_wasm::Signature,_unsigned_int>,_true> local_30;
  _Node_iterator_base<std::pair<const_wasm::Signature,_unsigned_int>,_true> local_28;
  const_iterator it;
  WasmBinaryWriter *this_local;
  Signature sig_local;
  
  sig_local.params = sig.results.id;
  this_local = (WasmBinaryWriter *)sig.params.id;
  it.super__Node_iterator_base<std::pair<const_wasm::Signature,_unsigned_int>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_wasm::Signature,_unsigned_int>,_true>)
       (_Node_iterator_base<std::pair<const_wasm::Signature,_unsigned_int>,_true>)this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Signature,_unsigned_int,_std::hash<wasm::Signature>,_std::equal_to<wasm::Signature>,_std::allocator<std::pair<const_wasm::Signature,_unsigned_int>_>_>
       ::find(&this->signatureIndexes,(key_type *)&this_local);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Signature,_unsigned_int,_std::hash<wasm::Signature>,_std::equal_to<wasm::Signature>,_std::allocator<std::pair<const_wasm::Signature,_unsigned_int>_>_>
       ::end(&this->signatureIndexes);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (!bVar1) {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_wasm::Signature,_unsigned_int>,_false,_true>::
             operator->((_Node_const_iterator<std::pair<const_wasm::Signature,_unsigned_int>,_false,_true>
                         *)&local_28);
    return pvVar3->second;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Missing signature: ");
  sig_00.results.id = in_RCX.id;
  sig_00.params.id = sig_local.params.id;
  poVar2 = wasm::operator<<((wasm *)poVar2,(ostream *)this_local,sig_00);
  std::operator<<(poVar2,'\n');
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                ,0x2e1,"uint32_t wasm::WasmBinaryWriter::getSignatureIndex(Signature) const");
}

Assistant:

uint32_t WasmBinaryWriter::getSignatureIndex(Signature sig) const {
  auto it = signatureIndexes.find(sig);
#ifndef NDEBUG
  if (it == signatureIndexes.end()) {
    std::cout << "Missing signature: " << sig << '\n';
    assert(0);
  }
#endif
  return it->second;
}